

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_36::WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>::
setCurrentWrapper(WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> *this,
                 Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *weakRef)

{
  bool bVar1;
  Fault local_50;
  Fault f;
  undefined1 local_40 [8];
  DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
  _kjCondition;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *weakRef_local;
  WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl> *this_local;
  
  _kjCondition._32_8_ = weakRef;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->currentWrapper);
  kj::_::DebugExpression<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>&>&>::
  operator==((DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
              *)local_40,
             (DebugExpression<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>&>&>
              *)&f,(None *)&kj::none);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl&>&>&,kj::None_const&>&,char_const(&)[65]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x525,FAILED,"currentWrapper == kj::none",
               "_kjCondition,\"bug in KJ HTTP: only one HTTP stream wrapper can exist at a time\"",
               (DebugComparison<kj::Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>_&,_const_kj::None_&>
                *)local_40,
               (char (*) [65])"bug in KJ HTTP: only one HTTP stream wrapper can exist at a time");
    kj::_::Debug::Fault::fatal(&local_50);
  }
  Maybe<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>_&>::operator=
            (&this->currentWrapper,
             (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)_kjCondition._32_8_);
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&>::operator=
            ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)_kjCondition._32_8_,
             (HttpInputStreamImpl *)(this + -1));
  return;
}

Assistant:

void setCurrentWrapper(kj::Maybe<Subclass&>& weakRef) {
    // Tracks the current `HttpEntityBodyReader` instance which is wrapping this stream. There can
    // be only one wrapper at a time, and the wrapper must be destroyed before the underlying HTTP
    // connection is torn down. The purpose of tracking the wrapper here is to detect when these
    // rules are violated by apps, and log an error instead of going UB.
    //
    // `weakRef` is the wrapper's pointer to this object. If the underlying stream is destroyed
    // before the wrapper, then `weakRef` will be nulled out.

    // The API should prevent an app from obtaining multiple wrappers with the same backing stream.
    KJ_ASSERT(currentWrapper == kj::none,
        "bug in KJ HTTP: only one HTTP stream wrapper can exist at a time");

    currentWrapper = weakRef;
    weakRef = static_cast<Subclass&>(*this);
  }